

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

bool __thiscall
bssl::Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_>::MaybeGrow
          (Vector<std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>_> *this)

{
  size_t sVar1;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *puVar2;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *puVar3;
  long lVar4;
  int line;
  ulong uVar5;
  
  uVar5 = this->capacity_;
  if (this->size_ < uVar5) {
    return true;
  }
  if (uVar5 == 0) {
    uVar5 = 0x10;
  }
  else {
    if ((long)uVar5 < 0) {
      line = 0x14d;
      goto LAB_0014ff0d;
    }
    uVar5 = uVar5 * 2;
  }
  if (uVar5 >> 0x3d == 0) {
    puVar3 = (unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)OPENSSL_malloc(uVar5 * 8);
    if (puVar3 == (unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)0x0) {
      return puVar3 != (unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)0x0;
    }
    sVar1 = this->size_;
    if (sVar1 != 0) {
      puVar2 = this->data_;
      lVar4 = 0;
      do {
        *(undefined8 *)
         ((long)&(puVar3->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl + lVar4) =
             *(undefined8 *)
              ((long)&(puVar2->_M_t).
                      super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl + lVar4);
        *(undefined8 *)
         ((long)&(puVar2->_M_t).super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl + lVar4) = 0;
        lVar4 = lVar4 + 8;
      } while (sVar1 * 8 - lVar4 != 0);
    }
    clear(this);
    this->data_ = puVar3;
    this->size_ = sVar1;
    this->capacity_ = uVar5;
    return true;
  }
  line = 0x153;
LAB_0014ff0d:
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/../crypto/mem_internal.h"
                ,line);
  return false;
}

Assistant:

bool MaybeGrow() {
    // No need to grow if we have room for one more T.
    if (size_ < capacity_) {
      return true;
    }
    size_t new_capacity = kDefaultSize;
    if (capacity_ > 0) {
      // Double the array's size if it's safe to do so.
      if (capacity_ > SIZE_MAX / 2) {
        OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
        return false;
      }
      new_capacity = capacity_ * 2;
    }
    if (new_capacity > SIZE_MAX / sizeof(T)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      return false;
    }
    T *new_data =
        reinterpret_cast<T *>(OPENSSL_malloc(new_capacity * sizeof(T)));
    if (new_data == nullptr) {
      return false;
    }
    size_t new_size = size_;
    std::uninitialized_move(begin(), end(), new_data);
    clear();
    data_ = new_data;
    size_ = new_size;
    capacity_ = new_capacity;
    return true;
  }